

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void * __thiscall google::protobuf::Arena::SlowAlloc(Arena *this,size_t n)

{
  size_t sVar1;
  undefined8 *me;
  Block *pBVar2;
  
  me = (undefined8 *)__tls_get_addr(&PTR_007753e8);
  pBVar2 = FindBlock(this,me);
  if ((pBVar2 == (Block *)0x0) || (pBVar2->size - pBVar2->pos < n)) {
    pBVar2 = NewBlock(this,me,pBVar2,n,*(size_t *)(this + 0x40),*(size_t *)(this + 0x48));
    AddBlock(this,pBVar2);
    me[1] = pBVar2;
    *me = *(undefined8 *)this;
    pBVar2 = pBVar2 + 1;
  }
  else {
    me[1] = pBVar2;
    *me = *(undefined8 *)this;
    *(Block **)(this + 0x10) = pBVar2;
    sVar1 = pBVar2->pos;
    pBVar2->pos = n + sVar1;
    pBVar2 = (Block *)((long)&pBVar2->owner + sVar1);
  }
  return pBVar2;
}

Assistant:

void* Arena::SlowAlloc(size_t n) {
  void* me = &thread_cache();
  Block* b = FindBlock(me);  // Find block owned by me.
  // See if allocation fits in my latest block.
  if (b != NULL && b->avail() >= n) {
    SetThreadCacheBlock(b);
    google::protobuf::internal::NoBarrier_Store(&hint_, reinterpret_cast<google::protobuf::internal::AtomicWord>(b));
    return AllocFromBlock(b, n);
  }
  b = NewBlock(me, b, n, options_.start_block_size, options_.max_block_size);
  AddBlock(b);
  SetThreadCacheBlock(b);
  return reinterpret_cast<char*>(b) + kHeaderSize;
}